

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O0

void av1_cdef_frame_mt(AV1_COMMON *cm,MACROBLOCKD *xd,AV1CdefWorkerData *cdef_worker,
                      AVxWorker *workers,AV1CdefSync *cdef_sync,int num_workers,
                      cdef_init_fb_row_t cdef_init_fb_row_fn,int do_extend_border)

{
  int iVar1;
  AV1CdefWorkerData *in_RCX;
  MACROBLOCKD *in_RDX;
  AV1_COMMON *in_RSI;
  AV1_COMMON *in_RDI;
  AV1CdefSync *in_R8;
  undefined4 in_R9D;
  int unaff_retaddr;
  BLOCK_SIZE unaff_retaddr_00;
  macroblockd_plane *in_stack_00000008;
  int in_stack_00000010;
  int num_planes;
  YV12_BUFFER_CONFIG *frame;
  int in_stack_00000174;
  AV1_COMMON *in_stack_00000178;
  AVxWorker *in_stack_00000180;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  AV1CdefSync *cdef_sync_00;
  undefined4 in_stack_ffffffffffffffd0;
  
  cdef_sync_00 = (AV1CdefSync *)&in_RDI->cur_frame->buf;
  iVar1 = av1_num_planes(in_RDI);
  av1_setup_dst_planes
            (in_stack_00000008,unaff_retaddr_00,(YV12_BUFFER_CONFIG *)in_RDI,
             (int)((ulong)in_RSI >> 0x20),(int)in_RSI,(int)((ulong)in_RDX >> 0x20),(int)cdef_sync);
  reset_cdef_job_info(in_R8);
  prepare_cdef_frame_workers
            (in_RSI,in_RDX,in_RCX,(AVxWorkerHook)in_R8,
             (AVxWorker *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),cdef_sync_00,unaff_retaddr,
             (cdef_init_fb_row_t)in_stack_00000008,in_stack_00000010);
  launch_cdef_workers((AVxWorker *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),
                      in_stack_ffffffffffffffbc);
  sync_cdef_workers(in_stack_00000180,in_stack_00000178,in_stack_00000174);
  return;
}

Assistant:

void av1_cdef_frame_mt(AV1_COMMON *const cm, MACROBLOCKD *const xd,
                       AV1CdefWorkerData *const cdef_worker,
                       AVxWorker *const workers, AV1CdefSync *const cdef_sync,
                       int num_workers, cdef_init_fb_row_t cdef_init_fb_row_fn,
                       int do_extend_border) {
  YV12_BUFFER_CONFIG *frame = &cm->cur_frame->buf;
  const int num_planes = av1_num_planes(cm);

  av1_setup_dst_planes(xd->plane, cm->seq_params->sb_size, frame, 0, 0, 0,
                       num_planes);

  reset_cdef_job_info(cdef_sync);
  prepare_cdef_frame_workers(cm, xd, cdef_worker, cdef_sb_row_worker_hook,
                             workers, cdef_sync, num_workers,
                             cdef_init_fb_row_fn, do_extend_border);
  launch_cdef_workers(workers, num_workers);
  sync_cdef_workers(workers, cm, num_workers);
}